

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.h
# Opt level: O2

void __thiscall cfd::core::ExtPrivkey::~ExtPrivkey(ExtPrivkey *this)

{
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->tweak_sum_);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->privkey_);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->chaincode_);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return;
}

Assistant:

class CFD_CORE_EXPORT ExtPrivkey {
 public:
  /**
   * @brief bip32 serialize size
   */
  static constexpr uint32_t kSerializeSize = 78;  // BIP32_SERIALIZED_LEN
  /**
   * @brief hardened key definition
   */
  static constexpr uint32_t kHardenedKey = 0x80000000;
  /**
   * @brief mainnet privkey version (BIP32_VER_MAIN_PRIVATE)
   */
  static constexpr uint32_t kVersionMainnetPrivkey = 0x0488ade4;
  /**
   * @brief testnet privkey version (BIP32_VER_TEST_PRIVATE)
   */
  static constexpr uint32_t kVersionTestnetPrivkey = 0x04358394;

  /**
   * @brief constructor.
   */
  ExtPrivkey();
  /**
   * @brief constructor.
   * @param[in] seed          seed byte
   * @param[in] network_type  network type
   */
  explicit ExtPrivkey(const ByteData& seed, NetType network_type);
  /**
   * @brief constructor.
   * @param[in] serialize_data  serialize data
   */
  explicit ExtPrivkey(const ByteData& serialize_data);
  /**
   * @brief constructor.
   * @param[in] serialize_data  serialize data
   * @param[in] tweak_sum       tweak sum
   */
  explicit ExtPrivkey(
      const ByteData& serialize_data, const ByteData256& tweak_sum);
  /**
   * @brief constructor.
   * @param[in] base58_data  base58 data
   */
  explicit ExtPrivkey(const std::string& base58_data);
  /**
   * @brief constructor.
   * @param[in] base58_data  base58 data
   * @param[in] tweak_sum    tweak sum
   */
  explicit ExtPrivkey(
      const std::string& base58_data, const ByteData256& tweak_sum);
  /**
   * @brief constructor.
   * @param[in] network_type       network type
   * @param[in] parent_key         parent privkey
   * @param[in] parent_chain_code  parent chain code
   * @param[in] parent_depth       parent depth
   * @param[in] child_num          child num
   */
  explicit ExtPrivkey(
      NetType network_type, const Privkey& parent_key,
      const ByteData256& parent_chain_code, uint8_t parent_depth,
      uint32_t child_num);
  /**
   * @brief constructor.
   * @param[in] network_type  network type
   * @param[in] parent_key    parent privkey
   * @param[in] privkey       privkey
   * @param[in] chain_code    chain code
   * @param[in] depth         depth
   * @param[in] child_num     child num
   */
  explicit ExtPrivkey(
      NetType network_type, const Privkey& parent_key, const Privkey& privkey,
      const ByteData256& chain_code, uint8_t depth, uint32_t child_num);
  /**
   * @brief constructor.
   * @param[in] network_type        network type
   * @param[in] parent_fingerprint  parent fingerprint(4byte)
   * @param[in] privkey             privkey
   * @param[in] chain_code          chain code
   * @param[in] depth               depth
   * @param[in] child_num           child num
   */
  explicit ExtPrivkey(
      NetType network_type, const ByteData& parent_fingerprint,
      const Privkey& privkey, const ByteData256& chain_code, uint8_t depth,
      uint32_t child_num);

  /**
   * @brief Get Serialize information of extension key.
   * @return serialize data
   */
  ByteData GetData() const;
  /**
   * @brief Get the Base58 string of the extended key.
   * @return base58 string
   */
  std::string ToString() const;

  /**
   * @brief Get a privkey.
   * @return Privkey
   */
  Privkey GetPrivkey() const;
  /**
   * @brief Acquires the extended private key of the specified hierarchy.
   * @param[in] child_num         child number
   * @return extended pubprivkeykey
   * @throws CfdException If invalid seed.
   */
  ExtPrivkey DerivePrivkey(uint32_t child_num) const;
  /**
   * @brief Acquires the extended private key of the specified hierarchy.
   * @param[in] path              child number path
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  ExtPrivkey DerivePrivkey(const std::vector<uint32_t>& path) const;
  /**
   * @brief Acquires the extended private key of the specified hierarchy.
   * @param[in] string_path     child number string path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPrivkey DerivePrivkey(const std::string& string_path) const;

  /**
   * @brief Derive extended privkey.
   * @param[in] path              child number path
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  KeyData DerivePrivkeyData(const std::vector<uint32_t>& path) const;
  /**
   * @brief Derive ext-privkey.
   * @param[in] string_path       child number string path
   * @return extended privkey
   * @throws CfdException If invalid seed.
   */
  KeyData DerivePrivkeyData(const std::string& string_path) const;

  /**
   * @brief Obtain the extended public key of the same layer.
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey GetExtPubkey() const;
  /**
   * @brief Obtain the extended public key of the specified hierarchy.
   * @param[in] child_num         child number
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey DerivePubkey(uint32_t child_num) const;
  /**
   * @brief Obtain the extended public key of the specified hierarchy.
   * @param[in] path              child number path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey DerivePubkey(const std::vector<uint32_t>& path) const;
  /**
   * @brief Obtain the extended public key of the specified hierarchy.
   * @param[in] string_path     child number string path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey DerivePubkey(const std::string& string_path) const;

  /**
   * @brief Derive ext-pubkey.
   * @param[in] path              child number path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  KeyData DerivePubkeyData(const std::vector<uint32_t>& path) const;
  /**
   * @brief Derive extended pubkey.
   * @param[in] string_path       child number string path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  KeyData DerivePubkeyData(const std::string& string_path) const;

  /**
   * @brief Check if the data format is correct.
   * @retval true  valid
   * @retval false invalid
   */
  bool IsValid() const;

  /**
   * @brief Get depth.
   * @return depth value
   */
  uint8_t GetDepth() const;
  /**
   * @brief Get veresion.
   * @return version data (4byte)
   */
  uint32_t GetVersion() const;
  /**
   * @brief Get veresion.
   * @return version data (4byte)
   */
  ByteData GetVersionData() const;
  /**
   * @brief Get child number.
   * @return child number (4byte)
   */
  uint32_t GetChildNum() const;
  /**
   * @brief Get chain code.
   * @return chain code (32byte)
   */
  ByteData256 GetChainCode() const;
  /**
   * @brief Get fingerprint.
   * @return fingerprint data (4byte)
   */
  uint32_t GetFingerprint() const;
  /**
   * @brief Get fingerprint.
   * @return fingerprint data (4byte)
   */
  ByteData GetFingerprintData() const;
  /**
   * @brief Get the composite value of the tweak value generated in the process of generating the derived Pubkey.
   * @return tweak sum
   */
  ByteData256 GetPubTweakSum() const;
  /**
   * @brief Get network type.
   * @return network type.
   */
  NetType GetNetworkType() const;

 private:
  ByteData serialize_data_;   //!< serialize data
  uint32_t version_ = 0;      //!< version
  uint32_t fingerprint_ = 0;  //!< finger print
  uint8_t depth_ = 0;         //!< depth
  uint32_t child_num_ = 0;    //!< child number
  ByteData256 chaincode_;     //!< chain code
  Privkey privkey_;           //!< private key
  ByteData256 tweak_sum_;     //!< tweak sum
}